

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  undefined4 uVar10;
  int iVar11;
  undefined4 uVar12;
  size_t sVar13;
  undefined8 uVar14;
  Scene *pSVar15;
  float **ppfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  Geometry *pGVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  int iVar31;
  long lVar32;
  RTCRayN *pRVar33;
  undefined4 uVar34;
  ulong unaff_RBP;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar39;
  long lVar40;
  ulong uVar41;
  size_t sVar42;
  ulong uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar67;
  float fVar68;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  float fVar85;
  float fVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar81;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar96;
  float fVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar92;
  float fVar98;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar103;
  float fVar104;
  undefined1 auVar100 [16];
  float fVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar122;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar149 [16];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1278;
  ulong local_1270;
  ulong local_1268;
  ulong local_1260;
  RTCFilterFunctionNArguments args;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  vfloat<4> tNear;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  float local_1178 [4];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar39 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_10c8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_10d8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10e8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10f8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1108 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1138 = local_10f8 * 0.99999964;
  fVar117 = local_1108 * 0.99999964;
  local_1128 = local_1118 * 0.99999964;
  local_10f8 = local_10f8 * 1.0000004;
  local_1108 = local_1108 * 1.0000004;
  local_1118 = local_1118 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1268 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1270 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = local_1268 ^ 0x10;
  local_1260 = local_1270 ^ 0x10;
  iVar31 = (tray->tnear).field_0.i[k];
  auVar123._4_4_ = iVar31;
  auVar123._0_4_ = iVar31;
  auVar123._8_4_ = iVar31;
  auVar123._12_4_ = iVar31;
  iVar31 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar31;
  auVar58._0_4_ = iVar31;
  auVar58._8_4_ = iVar31;
  auVar58._12_4_ = iVar31;
  local_1278 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  fStack_1124 = local_1128;
  fStack_1120 = local_1128;
  fStack_111c = local_1128;
  fStack_1134 = local_1138;
  fStack_1130 = local_1138;
  fStack_112c = local_1138;
  uVar38 = local_1268;
  uVar43 = local_1270;
  fVar142 = local_10c8;
  fVar98 = local_10c8;
  fVar105 = local_10c8;
  fVar147 = local_10c8;
  fVar107 = local_10f8;
  fVar114 = local_10f8;
  fVar68 = local_10f8;
  fVar75 = local_10f8;
  fVar76 = local_1108;
  fVar77 = local_1108;
  fVar78 = local_1108;
  fVar85 = local_1108;
  fVar86 = local_1118;
  fVar87 = local_1118;
  fVar88 = local_1118;
  fVar96 = local_1118;
  fVar97 = local_1128;
  fVar99 = local_1128;
  fVar103 = local_1128;
  fVar104 = local_1128;
  fVar106 = local_10d8;
  fVar113 = local_10d8;
  fVar115 = local_10d8;
  fVar116 = local_10d8;
  fVar118 = local_10e8;
  fVar122 = local_10e8;
  fVar125 = local_10e8;
  fVar126 = local_10e8;
  fVar128 = local_1138;
  fVar129 = local_1138;
  fVar130 = local_1138;
  fVar131 = local_1138;
  do {
    do {
      do {
        if (pSVar39 == stack) {
          return;
        }
        pSVar30 = pSVar39 + -1;
        pSVar39 = pSVar39 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar30->dist &&
               (float)pSVar30->dist != *(float *)(ray + k * 4 + 0x80));
      sVar42 = (pSVar39->ptr).ptr;
      do {
        if ((sVar42 & 8) == 0) {
          pfVar8 = (float *)(sVar42 + 0x20 + uVar36);
          auVar48._0_4_ = (*pfVar8 - fVar142) * fVar128;
          auVar48._4_4_ = (pfVar8[1] - fVar98) * fVar129;
          auVar48._8_4_ = (pfVar8[2] - fVar105) * fVar130;
          auVar48._12_4_ = (pfVar8[3] - fVar147) * fVar131;
          pfVar8 = (float *)(sVar42 + 0x20 + uVar38);
          auVar110._0_4_ = (*pfVar8 - fVar106) * fVar117;
          auVar110._4_4_ = (pfVar8[1] - fVar113) * fVar117;
          auVar110._8_4_ = (pfVar8[2] - fVar115) * fVar117;
          auVar110._12_4_ = (pfVar8[3] - fVar116) * fVar117;
          auVar48 = maxps(auVar48,auVar110);
          pfVar8 = (float *)(sVar42 + 0x20 + uVar43);
          auVar111._0_4_ = (*pfVar8 - fVar118) * fVar97;
          auVar111._4_4_ = (pfVar8[1] - fVar122) * fVar99;
          auVar111._8_4_ = (pfVar8[2] - fVar125) * fVar103;
          auVar111._12_4_ = (pfVar8[3] - fVar126) * fVar104;
          auVar79 = maxps(auVar111,auVar123);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar48,auVar79);
          pfVar8 = (float *)(sVar42 + 0x20 + (uVar36 ^ 0x10));
          auVar120._0_4_ = (*pfVar8 - fVar142) * fVar107;
          auVar120._4_4_ = (pfVar8[1] - fVar98) * fVar114;
          auVar120._8_4_ = (pfVar8[2] - fVar105) * fVar68;
          auVar120._12_4_ = (pfVar8[3] - fVar147) * fVar75;
          pfVar8 = (float *)(sVar42 + 0x20 + uVar35);
          auVar89._0_4_ = (*pfVar8 - fVar106) * fVar76;
          auVar89._4_4_ = (pfVar8[1] - fVar113) * fVar77;
          auVar89._8_4_ = (pfVar8[2] - fVar115) * fVar78;
          auVar89._12_4_ = (pfVar8[3] - fVar116) * fVar85;
          auVar48 = minps(auVar120,auVar89);
          pfVar8 = (float *)(sVar42 + 0x20 + local_1260);
          auVar90._0_4_ = (*pfVar8 - fVar118) * fVar86;
          auVar90._4_4_ = (pfVar8[1] - fVar122) * fVar87;
          auVar90._8_4_ = (pfVar8[2] - fVar125) * fVar88;
          auVar90._12_4_ = (pfVar8[3] - fVar126) * fVar96;
          auVar79 = minps(auVar90,auVar58);
          auVar48 = minps(auVar48,auVar79);
          auVar79._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar48._4_4_);
          auVar79._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar48._0_4_);
          auVar79._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar48._8_4_);
          auVar79._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar48._12_4_);
          uVar34 = movmskps((int)unaff_RBP,auVar79);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar34);
        }
        if ((sVar42 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar31 = 4;
          }
          else {
            uVar41 = sVar42 & 0xfffffffffffffff0;
            lVar40 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            iVar31 = 0;
            sVar42 = *(size_t *)(uVar41 + lVar40 * 8);
            uVar37 = unaff_RBP - 1 & unaff_RBP;
            if (uVar37 != 0) {
              uVar44 = tNear.field_0.i[lVar40];
              lVar40 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              sVar13 = *(size_t *)(uVar41 + lVar40 * 8);
              uVar45 = tNear.field_0.i[lVar40];
              uVar37 = uVar37 - 1 & uVar37;
              if (uVar37 == 0) {
                if (uVar44 < uVar45) {
                  (pSVar39->ptr).ptr = sVar13;
                  pSVar39->dist = uVar45;
                  pSVar39 = pSVar39 + 1;
                }
                else {
                  (pSVar39->ptr).ptr = sVar42;
                  pSVar39->dist = uVar44;
                  pSVar39 = pSVar39 + 1;
                  sVar42 = sVar13;
                }
              }
              else {
                auVar80._8_4_ = uVar44;
                auVar80._0_8_ = sVar42;
                auVar80._12_4_ = 0;
                auVar108._8_4_ = uVar45;
                auVar108._0_8_ = sVar13;
                auVar108._12_4_ = 0;
                lVar40 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                uVar14 = *(undefined8 *)(uVar41 + lVar40 * 8);
                iVar11 = tNear.field_0.i[lVar40];
                auVar91._8_4_ = iVar11;
                auVar91._0_8_ = uVar14;
                auVar91._12_4_ = 0;
                auVar49._8_4_ = -(uint)((int)uVar44 < (int)uVar45);
                uVar37 = uVar37 - 1 & uVar37;
                if (uVar37 == 0) {
                  auVar49._4_4_ = auVar49._8_4_;
                  auVar49._0_4_ = auVar49._8_4_;
                  auVar49._12_4_ = auVar49._8_4_;
                  auVar100._8_4_ = uVar45;
                  auVar100._0_8_ = sVar13;
                  auVar100._12_4_ = 0;
                  auVar79 = blendvps(auVar100,auVar80,auVar49);
                  auVar48 = blendvps(auVar80,auVar108,auVar49);
                  auVar50._8_4_ = -(uint)(auVar79._8_4_ < iVar11);
                  auVar50._4_4_ = auVar50._8_4_;
                  auVar50._0_4_ = auVar50._8_4_;
                  auVar50._12_4_ = auVar50._8_4_;
                  auVar109._8_4_ = iVar11;
                  auVar109._0_8_ = uVar14;
                  auVar109._12_4_ = 0;
                  auVar110 = blendvps(auVar109,auVar79,auVar50);
                  auVar79 = blendvps(auVar79,auVar91,auVar50);
                  auVar51._8_4_ = -(uint)(auVar48._8_4_ < auVar79._8_4_);
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar48,auVar51);
                  SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar48,auVar79,auVar51);
                  *pSVar39 = SVar81;
                  pSVar39[1] = SVar92;
                  sVar42 = auVar110._0_8_;
                  pSVar39 = pSVar39 + 2;
                }
                else {
                  lVar40 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                    }
                  }
                  auVar52._4_4_ = auVar49._8_4_;
                  auVar52._0_4_ = auVar49._8_4_;
                  auVar52._8_4_ = auVar49._8_4_;
                  auVar52._12_4_ = auVar49._8_4_;
                  auVar110 = blendvps(auVar108,auVar80,auVar52);
                  auVar48 = blendvps(auVar80,auVar108,auVar52);
                  auVar119._8_4_ = tNear.field_0.i[lVar40];
                  auVar119._0_8_ = *(undefined8 *)(uVar41 + lVar40 * 8);
                  auVar119._12_4_ = 0;
                  auVar53._8_4_ = -(uint)(iVar11 < tNear.field_0.i[lVar40]);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar111 = blendvps(auVar119,auVar91,auVar53);
                  auVar79 = blendvps(auVar91,auVar119,auVar53);
                  auVar54._8_4_ = -(uint)(auVar48._8_4_ < auVar79._8_4_);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  auVar120 = blendvps(auVar79,auVar48,auVar54);
                  SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar48,auVar79,auVar54);
                  auVar55._8_4_ = -(uint)(auVar110._8_4_ < auVar111._8_4_);
                  auVar55._4_4_ = auVar55._8_4_;
                  auVar55._0_4_ = auVar55._8_4_;
                  auVar55._12_4_ = auVar55._8_4_;
                  auVar48 = blendvps(auVar111,auVar110,auVar55);
                  auVar79 = blendvps(auVar110,auVar111,auVar55);
                  auVar56._8_4_ = -(uint)(auVar79._8_4_ < auVar120._8_4_);
                  auVar56._4_4_ = auVar56._8_4_;
                  auVar56._0_4_ = auVar56._8_4_;
                  auVar56._12_4_ = auVar56._8_4_;
                  SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar120,auVar79,auVar56);
                  SVar92 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar79,auVar120,auVar56);
                  *pSVar39 = SVar81;
                  pSVar39[1] = SVar92;
                  pSVar39[2] = SVar112;
                  sVar42 = auVar48._0_8_;
                  pSVar39 = pSVar39 + 3;
                }
              }
            }
          }
        }
        else {
          iVar31 = 6;
        }
      } while (iVar31 == 0);
    } while (iVar31 != 6);
    uVar38 = (ulong)((uint)sVar42 & 0xf);
    if (uVar38 != 8) {
      uVar43 = sVar42 & 0xfffffffffffffff0;
      lVar40 = 0;
      do {
        lVar32 = lVar40 * 0x50;
        pSVar15 = context->scene;
        ppfVar16 = (pSVar15->vertices).items;
        pfVar17 = ppfVar16[*(uint *)(uVar43 + 0x30 + lVar32)];
        pfVar8 = pfVar17 + *(uint *)(uVar43 + lVar32);
        pfVar1 = pfVar17 + *(uint *)(uVar43 + 0x10 + lVar32);
        pfVar17 = pfVar17 + *(uint *)(uVar43 + 0x20 + lVar32);
        pfVar18 = ppfVar16[*(uint *)(uVar43 + 0x34 + lVar32)];
        pfVar2 = pfVar18 + *(uint *)(uVar43 + 4 + lVar32);
        pfVar3 = pfVar18 + *(uint *)(uVar43 + 0x14 + lVar32);
        pfVar18 = pfVar18 + *(uint *)(uVar43 + 0x24 + lVar32);
        pfVar19 = ppfVar16[*(uint *)(uVar43 + 0x38 + lVar32)];
        pfVar4 = pfVar19 + *(uint *)(uVar43 + 8 + lVar32);
        pfVar5 = pfVar19 + *(uint *)(uVar43 + 0x18 + lVar32);
        pfVar19 = pfVar19 + *(uint *)(uVar43 + 0x28 + lVar32);
        pfVar20 = ppfVar16[*(uint *)(uVar43 + 0x3c + lVar32)];
        pfVar6 = pfVar20 + *(uint *)(uVar43 + 0xc + lVar32);
        pfVar7 = pfVar20 + *(uint *)(uVar43 + 0x1c + lVar32);
        pfVar20 = pfVar20 + *(uint *)(uVar43 + 0x2c + lVar32);
        puVar9 = (undefined8 *)(uVar43 + 0x30 + lVar32);
        local_1018 = *puVar9;
        uStack_1010 = puVar9[1];
        puVar9 = (undefined8 *)(uVar43 + 0x40 + lVar32);
        local_11f8 = *puVar9;
        uStack_11f0 = puVar9[1];
        fVar142 = *(float *)(ray + k * 4);
        fVar98 = *(float *)(ray + k * 4 + 0x10);
        fVar105 = *(float *)(ray + k * 4 + 0x20);
        fVar143 = *pfVar8 - fVar142;
        fVar144 = *pfVar2 - fVar142;
        fVar145 = *pfVar4 - fVar142;
        fVar146 = *pfVar6 - fVar142;
        local_1028 = pfVar8[1] - fVar98;
        fStack_1024 = pfVar2[1] - fVar98;
        fStack_1020 = pfVar4[1] - fVar98;
        fStack_101c = pfVar6[1] - fVar98;
        local_1068 = pfVar8[2] - fVar105;
        fStack_1064 = pfVar2[2] - fVar105;
        fStack_1060 = pfVar4[2] - fVar105;
        fStack_105c = pfVar6[2] - fVar105;
        fVar68 = *pfVar1 - fVar142;
        fVar75 = *pfVar3 - fVar142;
        fVar76 = *pfVar5 - fVar142;
        fVar77 = *pfVar7 - fVar142;
        fVar78 = pfVar1[1] - fVar98;
        fVar85 = pfVar3[1] - fVar98;
        fVar86 = pfVar5[1] - fVar98;
        fVar87 = pfVar7[1] - fVar98;
        fVar125 = pfVar1[2] - fVar105;
        fVar128 = pfVar3[2] - fVar105;
        fVar130 = pfVar5[2] - fVar105;
        fVar132 = pfVar7[2] - fVar105;
        fVar139 = *pfVar17 - fVar142;
        fVar140 = *pfVar18 - fVar142;
        fVar141 = *pfVar19 - fVar142;
        fVar142 = *pfVar20 - fVar142;
        fVar88 = pfVar17[1] - fVar98;
        fVar96 = pfVar18[1] - fVar98;
        fVar97 = pfVar19[1] - fVar98;
        fVar98 = pfVar20[1] - fVar98;
        fVar99 = pfVar17[2] - fVar105;
        fVar103 = pfVar18[2] - fVar105;
        fVar104 = pfVar19[2] - fVar105;
        fVar105 = pfVar20[2] - fVar105;
        local_1038 = fVar139 - fVar143;
        fStack_1034 = fVar140 - fVar144;
        fStack_1030 = fVar141 - fVar145;
        fStack_102c = fVar142 - fVar146;
        local_1058 = fVar88 - local_1028;
        fStack_1054 = fVar96 - fStack_1024;
        fStack_1050 = fVar97 - fStack_1020;
        fStack_104c = fVar98 - fStack_101c;
        local_1048 = fVar99 - local_1068;
        fStack_1044 = fVar103 - fStack_1064;
        fStack_1040 = fVar104 - fStack_1060;
        fStack_103c = fVar105 - fStack_105c;
        fVar147 = *(float *)(ray + k * 4 + 0x50);
        fVar107 = *(float *)(ray + k * 4 + 0x60);
        fVar114 = *(float *)(ray + k * 4 + 0x40);
        fVar118 = (local_1058 * (fVar99 + local_1068) - (fVar88 + local_1028) * local_1048) *
                  fVar114 + ((fVar139 + fVar143) * local_1048 - (fVar99 + local_1068) * local_1038)
                            * fVar147 +
                            (local_1038 * (fVar88 + local_1028) - (fVar139 + fVar143) * local_1058)
                            * fVar107;
        fVar122 = (fStack_1054 * (fVar103 + fStack_1064) - (fVar96 + fStack_1024) * fStack_1044) *
                  fVar114 + ((fVar140 + fVar144) * fStack_1044 -
                            (fVar103 + fStack_1064) * fStack_1034) * fVar147 +
                            (fStack_1034 * (fVar96 + fStack_1024) -
                            (fVar140 + fVar144) * fStack_1054) * fVar107;
        local_10b8._0_8_ = CONCAT44(fVar122,fVar118);
        local_10b8._8_4_ =
             (fStack_1050 * (fVar104 + fStack_1060) - (fVar97 + fStack_1020) * fStack_1040) *
             fVar114 + ((fVar141 + fVar145) * fStack_1040 - (fVar104 + fStack_1060) * fStack_1030) *
                       fVar147 + (fStack_1030 * (fVar97 + fStack_1020) -
                                 (fVar141 + fVar145) * fStack_1050) * fVar107;
        local_10b8._12_4_ =
             (fStack_104c * (fVar105 + fStack_105c) - (fVar98 + fStack_101c) * fStack_103c) *
             fVar114 + ((fVar142 + fVar146) * fStack_103c - (fVar105 + fStack_105c) * fStack_102c) *
                       fVar147 + (fStack_102c * (fVar98 + fStack_101c) -
                                 (fVar142 + fVar146) * fStack_104c) * fVar107;
        fVar126 = fVar143 - fVar68;
        fVar129 = fVar144 - fVar75;
        fVar131 = fVar145 - fVar76;
        fVar133 = fVar146 - fVar77;
        fVar134 = local_1028 - fVar78;
        fVar136 = fStack_1024 - fVar85;
        fVar137 = fStack_1020 - fVar86;
        fVar138 = fStack_101c - fVar87;
        local_1078 = local_1068 - fVar125;
        fStack_1074 = fStack_1064 - fVar128;
        fStack_1070 = fStack_1060 - fVar130;
        fStack_106c = fStack_105c - fVar132;
        local_1098._0_4_ =
             (fVar134 * (local_1068 + fVar125) - (local_1028 + fVar78) * local_1078) * fVar114 +
             ((fVar143 + fVar68) * local_1078 - (local_1068 + fVar125) * fVar126) * fVar147 +
             (fVar126 * (local_1028 + fVar78) - (fVar143 + fVar68) * fVar134) * fVar107;
        local_1098._4_4_ =
             (fVar136 * (fStack_1064 + fVar128) - (fStack_1024 + fVar85) * fStack_1074) * fVar114 +
             ((fVar144 + fVar75) * fStack_1074 - (fStack_1064 + fVar128) * fVar129) * fVar147 +
             (fVar129 * (fStack_1024 + fVar85) - (fVar144 + fVar75) * fVar136) * fVar107;
        local_1098._8_4_ =
             (fVar137 * (fStack_1060 + fVar130) - (fStack_1020 + fVar86) * fStack_1070) * fVar114 +
             ((fVar145 + fVar76) * fStack_1070 - (fStack_1060 + fVar130) * fVar131) * fVar147 +
             (fVar131 * (fStack_1020 + fVar86) - (fVar145 + fVar76) * fVar137) * fVar107;
        local_1098._12_4_ =
             (fVar138 * (fStack_105c + fVar132) - (fStack_101c + fVar87) * fStack_106c) * fVar114 +
             ((fVar146 + fVar77) * fStack_106c - (fStack_105c + fVar132) * fVar133) * fVar147 +
             (fVar133 * (fStack_101c + fVar87) - (fVar146 + fVar77) * fVar138) * fVar107;
        fVar148 = fVar68 - fVar139;
        fVar150 = fVar75 - fVar140;
        fVar151 = fVar76 - fVar141;
        fVar152 = fVar77 - fVar142;
        fVar106 = fVar78 - fVar88;
        fVar113 = fVar85 - fVar96;
        fVar115 = fVar86 - fVar97;
        fVar116 = fVar87 - fVar98;
        local_1088 = fVar125 - fVar99;
        fStack_1084 = fVar128 - fVar103;
        fStack_1080 = fVar130 - fVar104;
        fStack_107c = fVar132 - fVar105;
        auVar69._0_4_ =
             (fVar106 * (fVar99 + fVar125) - (fVar88 + fVar78) * local_1088) * fVar114 +
             ((fVar139 + fVar68) * local_1088 - (fVar99 + fVar125) * fVar148) * fVar147 +
             (fVar148 * (fVar88 + fVar78) - (fVar139 + fVar68) * fVar106) * fVar107;
        auVar69._4_4_ =
             (fVar113 * (fVar103 + fVar128) - (fVar96 + fVar85) * fStack_1084) * fVar114 +
             ((fVar140 + fVar75) * fStack_1084 - (fVar103 + fVar128) * fVar150) * fVar147 +
             (fVar150 * (fVar96 + fVar85) - (fVar140 + fVar75) * fVar113) * fVar107;
        auVar69._8_4_ =
             (fVar115 * (fVar104 + fVar130) - (fVar97 + fVar86) * fStack_1080) * fVar114 +
             ((fVar141 + fVar76) * fStack_1080 - (fVar104 + fVar130) * fVar151) * fVar147 +
             (fVar151 * (fVar97 + fVar86) - (fVar141 + fVar76) * fVar115) * fVar107;
        auVar69._12_4_ =
             (fVar116 * (fVar105 + fVar132) - (fVar98 + fVar87) * fStack_107c) * fVar114 +
             ((fVar142 + fVar77) * fStack_107c - (fVar105 + fVar132) * fVar152) * fVar147 +
             (fVar152 * (fVar98 + fVar87) - (fVar142 + fVar77) * fVar116) * fVar107;
        local_10a8 = fVar118 + local_1098._0_4_ + auVar69._0_4_;
        fStack_10a4 = fVar122 + local_1098._4_4_ + auVar69._4_4_;
        fStack_10a0 = local_10b8._8_4_ + local_1098._8_4_ + auVar69._8_4_;
        fStack_109c = local_10b8._12_4_ + local_1098._12_4_ + auVar69._12_4_;
        auVar57._8_4_ = local_10b8._8_4_;
        auVar57._0_8_ = local_10b8._0_8_;
        auVar57._12_4_ = local_10b8._12_4_;
        auVar58 = minps(auVar57,local_1098);
        auVar58 = minps(auVar58,auVar69);
        auVar101._8_4_ = local_10b8._8_4_;
        auVar101._0_8_ = local_10b8._0_8_;
        auVar101._12_4_ = local_10b8._12_4_;
        auVar48 = maxps(auVar101,local_1098);
        auVar48 = maxps(auVar48,auVar69);
        fVar142 = ABS(local_10a8) * 1.1920929e-07;
        fVar98 = ABS(fStack_10a4) * 1.1920929e-07;
        fVar105 = ABS(fStack_10a0) * 1.1920929e-07;
        fVar68 = ABS(fStack_109c) * 1.1920929e-07;
        auVar102._4_4_ = -(uint)(auVar48._4_4_ <= fVar98);
        auVar102._0_4_ = -(uint)(auVar48._0_4_ <= fVar142);
        auVar102._8_4_ = -(uint)(auVar48._8_4_ <= fVar105);
        auVar102._12_4_ = -(uint)(auVar48._12_4_ <= fVar68);
        auVar59._4_4_ = -(uint)(-fVar98 <= auVar58._4_4_);
        auVar59._0_4_ = -(uint)(-fVar142 <= auVar58._0_4_);
        auVar59._8_4_ = -(uint)(-fVar105 <= auVar58._8_4_);
        auVar59._12_4_ = -(uint)(-fVar68 <= auVar58._12_4_);
        auVar102 = auVar102 | auVar59;
        iVar31 = movmskps((int)&mapUV,auVar102);
        if (iVar31 != 0) {
          auVar135._0_4_ = fVar134 * local_1088 - fVar106 * local_1078;
          auVar135._4_4_ = fVar136 * fStack_1084 - fVar113 * fStack_1074;
          auVar135._8_4_ = fVar137 * fStack_1080 - fVar115 * fStack_1070;
          auVar135._12_4_ = fVar138 * fStack_107c - fVar116 * fStack_106c;
          auVar60._4_4_ = -(uint)(ABS(fVar136 * fStack_1044) < ABS(fVar113 * fStack_1074));
          auVar60._0_4_ = -(uint)(ABS(fVar134 * local_1048) < ABS(fVar106 * local_1078));
          auVar60._8_4_ = -(uint)(ABS(fVar137 * fStack_1040) < ABS(fVar115 * fStack_1070));
          auVar60._12_4_ = -(uint)(ABS(fVar138 * fStack_103c) < ABS(fVar116 * fStack_106c));
          auVar23._4_4_ = fStack_1054 * fStack_1074 - fVar136 * fStack_1044;
          auVar23._0_4_ = local_1058 * local_1078 - fVar134 * local_1048;
          auVar23._8_4_ = fStack_1050 * fStack_1070 - fVar137 * fStack_1040;
          auVar23._12_4_ = fStack_104c * fStack_106c - fVar138 * fStack_103c;
          local_1168 = blendvps(auVar135,auVar23,auVar60);
          auVar124._0_4_ = local_1048 * fVar126 - local_1038 * local_1078;
          auVar124._4_4_ = fStack_1044 * fVar129 - fStack_1034 * fStack_1074;
          auVar124._8_4_ = fStack_1040 * fVar131 - fStack_1030 * fStack_1070;
          auVar124._12_4_ = fStack_103c * fVar133 - fStack_102c * fStack_106c;
          auVar149._0_4_ = fVar148 * local_1078 - fVar126 * local_1088;
          auVar149._4_4_ = fVar150 * fStack_1074 - fVar129 * fStack_1084;
          auVar149._8_4_ = fVar151 * fStack_1070 - fVar131 * fStack_1080;
          auVar149._12_4_ = fVar152 * fStack_106c - fVar133 * fStack_107c;
          auVar61._4_4_ = -(uint)(ABS(fStack_1034 * fStack_1074) < ABS(fVar129 * fStack_1084));
          auVar61._0_4_ = -(uint)(ABS(local_1038 * local_1078) < ABS(fVar126 * local_1088));
          auVar61._8_4_ = -(uint)(ABS(fStack_1030 * fStack_1070) < ABS(fVar131 * fStack_1080));
          auVar61._12_4_ = -(uint)(ABS(fStack_102c * fStack_106c) < ABS(fVar133 * fStack_107c));
          local_1158 = blendvps(auVar149,auVar124,auVar61);
          auVar127._0_4_ = fVar126 * fVar106 - fVar148 * fVar134;
          auVar127._4_4_ = fVar129 * fVar113 - fVar150 * fVar136;
          auVar127._8_4_ = fVar131 * fVar115 - fVar151 * fVar137;
          auVar127._12_4_ = fVar133 * fVar116 - fVar152 * fVar138;
          auVar62._4_4_ = -(uint)(ABS(fVar129 * fStack_1054) < ABS(fVar150 * fVar136));
          auVar62._0_4_ = -(uint)(ABS(fVar126 * local_1058) < ABS(fVar148 * fVar134));
          auVar62._8_4_ = -(uint)(ABS(fVar131 * fStack_1050) < ABS(fVar151 * fVar137));
          auVar62._12_4_ = -(uint)(ABS(fVar133 * fStack_104c) < ABS(fVar152 * fVar138));
          auVar26._4_4_ = fStack_1034 * fVar136 - fVar129 * fStack_1054;
          auVar26._0_4_ = local_1038 * fVar134 - fVar126 * local_1058;
          auVar26._8_4_ = fStack_1030 * fVar137 - fVar131 * fStack_1050;
          auVar26._12_4_ = fStack_102c * fVar138 - fVar133 * fStack_104c;
          local_1148 = blendvps(auVar127,auVar26,auVar62);
          fVar76 = fVar114 * local_1168._0_4_ +
                   fVar147 * local_1158._0_4_ + fVar107 * local_1148._0_4_;
          fVar77 = fVar114 * local_1168._4_4_ +
                   fVar147 * local_1158._4_4_ + fVar107 * local_1148._4_4_;
          fVar78 = fVar114 * local_1168._8_4_ +
                   fVar147 * local_1158._8_4_ + fVar107 * local_1148._8_4_;
          fVar85 = fVar114 * local_1168._12_4_ +
                   fVar147 * local_1158._12_4_ + fVar107 * local_1148._12_4_;
          fVar76 = fVar76 + fVar76;
          fVar77 = fVar77 + fVar77;
          fVar78 = fVar78 + fVar78;
          fVar85 = fVar85 + fVar85;
          auVar63._0_4_ = local_1028 * local_1158._0_4_ + local_1068 * local_1148._0_4_;
          auVar63._4_4_ = fStack_1024 * local_1158._4_4_ + fStack_1064 * local_1148._4_4_;
          auVar63._8_4_ = fStack_1020 * local_1158._8_4_ + fStack_1060 * local_1148._8_4_;
          auVar63._12_4_ = fStack_101c * local_1158._12_4_ + fStack_105c * local_1148._12_4_;
          fVar107 = fVar143 * local_1168._0_4_ + auVar63._0_4_;
          fVar114 = fVar144 * local_1168._4_4_ + auVar63._4_4_;
          fVar68 = fVar145 * local_1168._8_4_ + auVar63._8_4_;
          fVar75 = fVar146 * local_1168._12_4_ + auVar63._12_4_;
          auVar22._4_4_ = fVar77;
          auVar22._0_4_ = fVar76;
          auVar22._8_4_ = fVar78;
          auVar22._12_4_ = fVar85;
          auVar58 = rcpps(auVar63,auVar22);
          fVar142 = auVar58._0_4_;
          fVar98 = auVar58._4_4_;
          fVar105 = auVar58._8_4_;
          fVar147 = auVar58._12_4_;
          fVar107 = ((1.0 - fVar76 * fVar142) * fVar142 + fVar142) * (fVar107 + fVar107);
          fVar114 = ((1.0 - fVar77 * fVar98) * fVar98 + fVar98) * (fVar114 + fVar114);
          fVar105 = ((1.0 - fVar78 * fVar105) * fVar105 + fVar105) * (fVar68 + fVar68);
          fVar147 = ((1.0 - fVar85 * fVar147) * fVar147 + fVar147) * (fVar75 + fVar75);
          fVar142 = *(float *)(ray + k * 4 + 0x80);
          fVar98 = *(float *)(ray + k * 4 + 0x30);
          auVar70._4_4_ = -(uint)(fVar98 <= fVar114);
          auVar70._0_4_ = -(uint)(fVar98 <= fVar107);
          auVar70._8_4_ = -(uint)(fVar98 <= fVar105);
          auVar70._12_4_ = -(uint)(fVar98 <= fVar147);
          auVar64._0_4_ = -(uint)(fVar107 <= fVar142 && fVar98 <= fVar107) & auVar102._0_4_;
          auVar64._4_4_ = -(uint)(fVar114 <= fVar142 && fVar98 <= fVar114) & auVar102._4_4_;
          auVar64._8_4_ = -(uint)(fVar105 <= fVar142 && fVar98 <= fVar105) & auVar102._8_4_;
          auVar64._12_4_ = -(uint)(fVar147 <= fVar142 && fVar98 <= fVar147) & auVar102._12_4_;
          iVar31 = movmskps(iVar31,auVar64);
          if (iVar31 != 0) {
            valid.field_0.i[0] = auVar64._0_4_ & -(uint)(fVar76 != 0.0);
            valid.field_0.i[1] = auVar64._4_4_ & -(uint)(fVar77 != 0.0);
            valid.field_0.i[2] = auVar64._8_4_ & -(uint)(fVar78 != 0.0);
            valid.field_0.i[3] = auVar64._12_4_ & -(uint)(fVar85 != 0.0);
            iVar31 = movmskps(iVar31,(undefined1  [16])valid.field_0);
            if (iVar31 != 0) {
              tNear.field_0.v[2] = local_10b8._8_4_;
              tNear.field_0._0_8_ = local_10b8._0_8_;
              tNear.field_0.v[3] = local_10b8._12_4_;
              auVar29._4_4_ = fStack_10a4;
              auVar29._0_4_ = local_10a8;
              auVar29._8_4_ = fStack_10a0;
              auVar29._12_4_ = fStack_109c;
              local_1178[0] = fVar107;
              local_1178[1] = fVar114;
              local_1178[2] = fVar105;
              local_1178[3] = fVar147;
              auVar58 = rcpps(auVar70,auVar29);
              fVar142 = auVar58._0_4_;
              fVar98 = auVar58._4_4_;
              fVar68 = auVar58._8_4_;
              fVar75 = auVar58._12_4_;
              fVar142 = (float)(-(uint)(1e-18 <= ABS(local_10a8)) &
                               (uint)(((float)DAT_01feca10 - local_10a8 * fVar142) * fVar142 +
                                     fVar142));
              fVar98 = (float)(-(uint)(1e-18 <= ABS(fStack_10a4)) &
                              (uint)((DAT_01feca10._4_4_ - fStack_10a4 * fVar98) * fVar98 + fVar98))
              ;
              fVar68 = (float)(-(uint)(1e-18 <= ABS(fStack_10a0)) &
                              (uint)((DAT_01feca10._8_4_ - fStack_10a0 * fVar68) * fVar68 + fVar68))
              ;
              fVar75 = (float)(-(uint)(1e-18 <= ABS(fStack_109c)) &
                              (uint)((DAT_01feca10._12_4_ - fStack_109c * fVar75) * fVar75 + fVar75)
                              );
              auVar121._0_4_ = fVar118 * fVar142;
              auVar121._4_4_ = fVar122 * fVar98;
              auVar121._8_4_ = local_10b8._8_4_ * fVar68;
              auVar121._12_4_ = local_10b8._12_4_ * fVar75;
              local_1198 = minps(auVar121,_DAT_01feca10);
              auVar93._0_4_ = fVar142 * local_1098._0_4_;
              auVar93._4_4_ = fVar98 * local_1098._4_4_;
              auVar93._8_4_ = fVar68 * local_1098._8_4_;
              auVar93._12_4_ = fVar75 * local_1098._12_4_;
              local_1188 = minps(auVar93,_DAT_01feca10);
              auVar24._4_4_ = fVar114;
              auVar24._0_4_ = fVar107;
              auVar24._8_4_ = fVar105;
              auVar24._12_4_ = fVar147;
              auVar48 = blendvps(_DAT_01feb9f0,auVar24,(undefined1  [16])valid.field_0);
              auVar94._4_4_ = auVar48._0_4_;
              auVar94._0_4_ = auVar48._4_4_;
              auVar94._8_4_ = auVar48._12_4_;
              auVar94._12_4_ = auVar48._8_4_;
              auVar58 = minps(auVar94,auVar48);
              auVar71._0_8_ = auVar58._8_8_;
              auVar71._8_4_ = auVar58._0_4_;
              auVar71._12_4_ = auVar58._4_4_;
              auVar58 = minps(auVar71,auVar58);
              uVar44 = -(uint)(auVar58._0_4_ == auVar48._0_4_);
              uVar45 = -(uint)(auVar58._4_4_ == auVar48._4_4_);
              uVar46 = -(uint)(auVar58._8_4_ == auVar48._8_4_);
              uVar47 = -(uint)(auVar58._12_4_ == auVar48._12_4_);
              auVar84._4_4_ = uVar45;
              auVar84._0_4_ = uVar44;
              auVar82._0_4_ = uVar44 & valid.field_0.i[0];
              auVar82._4_4_ = uVar45 & valid.field_0.i[1];
              auVar82._8_4_ = uVar46 & valid.field_0.i[2];
              auVar82._12_4_ = uVar47 & valid.field_0.i[3];
              iVar31 = movmskps((int)&mapUV,auVar82);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              if (iVar31 != 0) {
                auVar84._8_4_ = uVar46;
                auVar84._12_4_ = uVar47;
                auVar83 = auVar84;
              }
              auVar65._0_4_ = valid.field_0.i[0] & auVar83._0_4_;
              auVar65._4_4_ = valid.field_0.i[1] & auVar83._4_4_;
              auVar65._8_4_ = valid.field_0.i[2] & auVar83._8_4_;
              auVar65._12_4_ = valid.field_0.i[3] & auVar83._12_4_;
              uVar34 = movmskps(iVar31,auVar65);
              uVar41 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar34);
              lVar32 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
LAB_00270b94:
              uVar44 = *(uint *)((long)&local_1018 + lVar32 * 4);
              pRVar33 = (RTCRayN *)(ulong)uVar44;
              pGVar21 = (pSVar15->geometries).items[(long)pRVar33].ptr;
              if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar32] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar34 = *(undefined4 *)(local_1198 + lVar32 * 4);
                  fVar142 = local_1178[lVar32 + -4];
                  *(float *)(ray + k * 4 + 0x80) = local_1178[lVar32];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1168 + lVar32 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1158 + lVar32 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1148 + lVar32 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar34;
                  *(float *)(ray + k * 4 + 0x100) = fVar142;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_11f8 + lVar32 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar44;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0027103c;
                }
                local_fd8 = *(undefined4 *)(local_1198 + lVar32 * 4);
                local_fc8 = local_1178[lVar32 + -4];
                uVar34 = *(undefined4 *)(local_1168 + lVar32 * 4);
                uVar10 = *(undefined4 *)(local_1158 + lVar32 * 4);
                local_fa8._4_4_ = uVar44;
                local_fa8._0_4_ = uVar44;
                local_fa8._8_4_ = uVar44;
                local_fa8._12_4_ = uVar44;
                uVar12 = *(undefined4 *)((long)&local_11f8 + lVar32 * 4);
                local_fb8._4_4_ = uVar12;
                local_fb8._0_4_ = uVar12;
                local_fb8._8_4_ = uVar12;
                local_fb8._12_4_ = uVar12;
                local_ff8._4_4_ = uVar10;
                local_ff8._0_4_ = uVar10;
                local_ff8._8_4_ = uVar10;
                local_ff8._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_1148 + lVar32 * 4);
                local_fe8._4_4_ = uVar10;
                local_fe8._0_4_ = uVar10;
                local_fe8._8_4_ = uVar10;
                local_fe8._12_4_ = uVar10;
                local_1008[0] = (RTCHitN)(char)uVar34;
                local_1008[1] = (RTCHitN)(char)((uint)uVar34 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar34;
                local_1008[5] = (RTCHitN)(char)((uint)uVar34 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar34;
                local_1008[9] = (RTCHitN)(char)((uint)uVar34 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar34;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar34 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                uStack_fd4 = local_fd8;
                uStack_fd0 = local_fd8;
                uStack_fcc = local_fd8;
                fStack_fc4 = local_fc8;
                fStack_fc0 = local_fc8;
                fStack_fbc = local_fc8;
                local_f98 = context->user->instID[0];
                uStack_f94 = local_f98;
                uStack_f90 = local_f98;
                uStack_f8c = local_f98;
                local_f88 = context->user->instPrimID[0];
                uStack_f84 = local_f88;
                uStack_f80 = local_f88;
                uStack_f7c = local_f88;
                uVar34 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1178[lVar32];
                local_1288 = *local_1278;
                uStack_1280 = local_1278[1];
                args.valid = (int *)&local_1288;
                args.geometryUserPtr = pGVar21->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pRVar33 = (RTCRayN *)pGVar21->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar33 != (RTCRayN *)0x0) {
                  pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                }
                auVar27._8_8_ = uStack_1280;
                auVar27._0_8_ = local_1288;
                if (auVar27 == (undefined1  [16])0x0) {
                  auVar72._8_4_ = 0xffffffff;
                  auVar72._0_8_ = 0xffffffffffffffff;
                  auVar72._12_4_ = 0xffffffff;
                  auVar72 = auVar72 ^ _DAT_01febe20;
                }
                else {
                  pRVar33 = (RTCRayN *)context->args->filter;
                  if ((pRVar33 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar21->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar33 = (RTCRayN *)(*(code *)pRVar33)(&args);
                  }
                  auVar28._8_8_ = uStack_1280;
                  auVar28._0_8_ = local_1288;
                  auVar66._0_4_ = -(uint)((int)local_1288 == 0);
                  auVar66._4_4_ = -(uint)((int)((ulong)local_1288 >> 0x20) == 0);
                  auVar66._8_4_ = -(uint)((int)uStack_1280 == 0);
                  auVar66._12_4_ = -(uint)((int)((ulong)uStack_1280 >> 0x20) == 0);
                  auVar72 = auVar66 ^ _DAT_01febe20;
                  if (auVar28 != (undefined1  [16])0x0) {
                    auVar58 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                    auVar58 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar66);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                    pRVar33 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar72) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar34;
                }
                valid.field_0.v[lVar32] = 0.0;
                fVar142 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fVar114 <= fVar142) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(fVar107 <= fVar142) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fVar105 <= fVar142) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar147 <= fVar142) & valid.field_0.i[3];
              }
              iVar31 = movmskps((int)pRVar33,(undefined1  [16])valid.field_0);
              if (iVar31 == 0) goto LAB_0027103c;
              auVar25._4_4_ = fVar114;
              auVar25._0_4_ = fVar107;
              auVar25._8_4_ = fVar105;
              auVar25._12_4_ = fVar147;
              auVar48 = blendvps(_DAT_01feb9f0,auVar25,(undefined1  [16])valid.field_0);
              auVar95._4_4_ = auVar48._0_4_;
              auVar95._0_4_ = auVar48._4_4_;
              auVar95._8_4_ = auVar48._12_4_;
              auVar95._12_4_ = auVar48._8_4_;
              auVar58 = minps(auVar95,auVar48);
              auVar73._0_8_ = auVar58._8_8_;
              auVar73._8_4_ = auVar58._0_4_;
              auVar73._12_4_ = auVar58._4_4_;
              auVar58 = minps(auVar73,auVar58);
              auVar74._0_8_ =
                   CONCAT44(-(uint)(auVar58._4_4_ == auVar48._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar58._0_4_ == auVar48._0_4_) & valid.field_0._0_4_);
              auVar74._8_4_ = -(uint)(auVar58._8_4_ == auVar48._8_4_) & valid.field_0._8_4_;
              auVar74._12_4_ = -(uint)(auVar58._12_4_ == auVar48._12_4_) & valid.field_0._12_4_;
              iVar31 = movmskps(iVar31,auVar74);
              aVar67 = valid.field_0;
              if (iVar31 != 0) {
                aVar67.i[2] = auVar74._8_4_;
                aVar67._0_8_ = auVar74._0_8_;
                aVar67.i[3] = auVar74._12_4_;
              }
              uVar34 = movmskps(iVar31,(undefined1  [16])aVar67);
              uVar41 = CONCAT44((int)((ulong)pRVar33 >> 0x20),uVar34);
              lVar32 = 0;
              if (uVar41 != 0) {
                for (; (uVar41 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              goto LAB_00270b94;
            }
          }
        }
LAB_0027103c:
        lVar40 = lVar40 + 1;
      } while (lVar40 != uVar38 - 8);
    }
    uVar34 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar58._4_4_ = uVar34;
    auVar58._0_4_ = uVar34;
    auVar58._8_4_ = uVar34;
    auVar58._12_4_ = uVar34;
    uVar38 = local_1268;
    uVar43 = local_1270;
    fVar142 = local_10c8;
    fVar98 = fStack_10c4;
    fVar105 = fStack_10c0;
    fVar147 = fStack_10bc;
    fVar107 = local_10f8;
    fVar114 = fStack_10f4;
    fVar68 = fStack_10f0;
    fVar75 = fStack_10ec;
    fVar76 = local_1108;
    fVar77 = fStack_1104;
    fVar78 = fStack_1100;
    fVar85 = fStack_10fc;
    fVar86 = local_1118;
    fVar87 = fStack_1114;
    fVar88 = fStack_1110;
    fVar96 = fStack_110c;
    fVar97 = local_1128;
    fVar99 = fStack_1124;
    fVar103 = fStack_1120;
    fVar104 = fStack_111c;
    fVar106 = local_10d8;
    fVar113 = fStack_10d4;
    fVar115 = fStack_10d0;
    fVar116 = fStack_10cc;
    fVar118 = local_10e8;
    fVar122 = fStack_10e4;
    fVar125 = fStack_10e0;
    fVar126 = fStack_10dc;
    fVar128 = local_1138;
    fVar129 = fStack_1134;
    fVar130 = fStack_1130;
    fVar131 = fStack_112c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }